

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O0

int handlessc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  int iVar1;
  bool bVar2;
  char *local_238;
  char *tmp;
  int iStack_228;
  char endchar;
  int pw;
  int chan;
  int maxrecvbuflen;
  int BytesReceived;
  int Bytes;
  char recvbuf [512];
  RS232PORT *pSSC32InterfacePseudoRS232Port_local;
  
  maxrecvbuflen = 0;
  chan = 0;
  pw = 0x200;
  iStack_228 = 0;
  tmp._4_4_ = 0;
  tmp._3_1_ = '\r';
  recvbuf._504_8_ = pSSC32InterfacePseudoRS232Port;
  iVar1 = CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port,(int *)0x0);
  if (iVar1 == 0) {
    memset(&BytesReceived,0,0x200);
    while( true ) {
      bVar2 = true;
      if (0 < chan) {
        bVar2 = *(char *)((long)&BytesReceived + (long)(chan + -1)) != tmp._3_1_;
      }
      if (!bVar2) break;
      if (pw <= chan) {
        return 1;
      }
      iVar1 = ReadRS232Port((RS232PORT *)recvbuf._504_8_,
                            (uint8 *)((long)&BytesReceived + (long)chan),1,&maxrecvbuflen);
      if (iVar1 != 0) {
        return 1;
      }
      if (maxrecvbuflen == 0) {
        return 1;
      }
      chan = maxrecvbuflen + chan;
    }
    EnterCriticalSection(&StateVariablesCS);
    for (local_238 = strstr((char *)&BytesReceived,"#"); local_238 != (char *)0x0;
        local_238 = strstr(local_238 + 1,"#")) {
      iVar1 = __isoc99_sscanf(local_238,"#%dP%d",&stack0xfffffffffffffdd8,(long)&tmp + 4);
      if (iVar1 == 2) {
        if (iStack_228 == 0) {
          ssc32_u1 = ((double)tmp._4_4_ - 1500.0) / 500.0;
        }
        if (iStack_228 == 1) {
          ssc32_u2 = ((double)tmp._4_4_ - 1500.0) / 500.0;
        }
        if (iStack_228 == 2) {
          ssc32_u3 = ((double)tmp._4_4_ - 1500.0) / 500.0;
        }
        if (iStack_228 == 3) {
          ssc32_u4 = ((double)tmp._4_4_ - 1500.0) / 500.0;
        }
        if (iStack_228 == 4) {
          ssc32_u5 = ((double)tmp._4_4_ - 1500.0) / 500.0;
        }
        if (robid == 0x200) {
LAB_001922f4:
          u = (ssc32_u2 + ssc32_u3) / 2.0;
          uw = (ssc32_u2 - ssc32_u3) / 2.0;
        }
        else if (((robid == 0x1000) || (robid == 0x2000)) || (robid == 0x4000)) {
LAB_0019221a:
          if (iStack_228 == 2) {
            u = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
          if (iStack_228 == 0) {
            uw = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
        }
        else if (robid == 0x8000) {
          if (iStack_228 == 0) {
            uw = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
          if (iStack_228 == 1) {
            u = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
        }
        else {
          if ((robid == 0x10000) || (robid == 0x20000)) goto LAB_001922f4;
          if ((robid == 0x100000) || (robid == 0x200000)) goto LAB_0019221a;
          if (iStack_228 == 0) {
            uw = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
          if (iStack_228 == 1) {
            u = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
          if (iStack_228 == 2) {
            uv = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
          if (iStack_228 == 3) {
            ul = ((double)tmp._4_4_ - 1500.0) / 500.0;
          }
        }
      }
      if (0x1fd < (long)&BytesReceived - (long)local_238) break;
    }
    LeaveCriticalSection(&StateVariablesCS);
  }
  else {
    uSleep(50000);
  }
  return 0;
}

Assistant:

int handlessc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	char recvbuf[MAX_NB_BYTES_SSC32];
	int Bytes = 0, BytesReceived = 0, maxrecvbuflen = MAX_NB_BYTES_SSC32, chan = 0, pw = 0;
	char endchar = '\r';
	char* tmp = NULL;

	// Get data...
	if (CheckAvailBytesRS232Port(pSSC32InterfacePseudoRS232Port, NULL) == EXIT_SUCCESS)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));

		// Receive byte per byte.
		while ((BytesReceived <= 0)||(recvbuf[BytesReceived-1] != endchar))
		{
			if (BytesReceived >= maxrecvbuflen)
			{
				return EXIT_FAILURE;
			}

			// Receive 1 byte.
			if (ReadRS232Port(pSSC32InterfacePseudoRS232Port, (uint8*)(recvbuf + BytesReceived), 1, &Bytes) == EXIT_SUCCESS)
			{
				if (Bytes == 0)
				{
					return EXIT_FAILURE;
				}
			}
			else
			{
				return EXIT_FAILURE;
			}

			BytesReceived += Bytes;
		}

		// Analyze data.

		EnterCriticalSection(&StateVariablesCS);

		tmp = strstr(recvbuf, "#");
		while (tmp)
		{
			if (sscanf(tmp, "#%dP%d", &chan, &pw) == 2)
			{
				if (chan == 0) ssc32_u1 = (pw-1500.0)/500.0;
				if (chan == 1) ssc32_u2 = (pw-1500.0)/500.0;
				if (chan == 2) ssc32_u3 = (pw-1500.0)/500.0;
				if (chan == 3) ssc32_u4 = (pw-1500.0)/500.0;
				if (chan == 4) ssc32_u5 = (pw-1500.0)/500.0;
				switch (robid)
				{
				case SAILBOAT_SIMULATOR_ROBID:
				case VAIMOS_ROBID:
				case SAILBOAT_ROBID:
				case BUGGY_SIMULATOR_ROBID:
				case BUGGY_ROBID:
					if (chan == 2) u = (pw-1500.0)/500.0;
					if (chan == 0) uw = (pw-1500.0)/500.0;
					break;
				case SAILBOAT2_ROBID:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					break;
				case BUBBLE_ROBID:
				case ETAS_WHEEL_ROBID:
				case TANK_SIMULATOR_ROBID:
					// To be compatible with default parameters of SSC320.txt...
					u = (ssc32_u2+ssc32_u3)/2;
					uw = (ssc32_u2-ssc32_u3)/2;
					break;
				case QUADRO_SIMULATOR_ROBID:
				case COPTER_ROBID:
				case ARDUCOPTER_ROBID:
				default:
					if (chan == 0) uw = (pw-1500.0)/500.0;
					if (chan == 1) u = (pw-1500.0)/500.0;
					if (chan == 2) uv = (pw-1500.0)/500.0;
					if (chan == 3) ul = (pw-1500.0)/500.0;
					break;
				}
			}
			if (recvbuf-tmp >= MAX_NB_BYTES_SSC32-2) break;
			tmp = strstr(tmp+1, "#");
		}

		LeaveCriticalSection(&StateVariablesCS);
	}
	else
	{
		uSleep(1000*50);
	}

	return EXIT_SUCCESS;
}